

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usetiter.cpp
# Opt level: O0

UBool __thiscall icu_63::UnicodeSetIterator::next(UnicodeSetIterator *this)

{
  int iVar1;
  UVector *this_00;
  UnicodeString *pUVar2;
  UnicodeSetIterator *this_local;
  
  if (this->endElement < this->nextElement) {
    if (this->range < this->endRange) {
      this->range = this->range + 1;
      (*(this->super_UObject)._vptr_UObject[3])();
      iVar1 = this->nextElement;
      this->nextElement = iVar1 + 1;
      this->codepointEnd = iVar1;
      this->codepoint = iVar1;
      this->string = (UnicodeString *)0x0;
      this_local._7_1_ = '\x01';
    }
    else if (this->nextString < this->stringCount) {
      this->codepoint = -1;
      this_00 = this->set->strings;
      iVar1 = this->nextString;
      this->nextString = iVar1 + 1;
      pUVar2 = (UnicodeString *)UVector::elementAt(this_00,iVar1);
      this->string = pUVar2;
      this_local._7_1_ = '\x01';
    }
    else {
      this_local._7_1_ = '\0';
    }
  }
  else {
    iVar1 = this->nextElement;
    this->nextElement = iVar1 + 1;
    this->codepointEnd = iVar1;
    this->codepoint = iVar1;
    this->string = (UnicodeString *)0x0;
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool UnicodeSetIterator::next() {
    if (nextElement <= endElement) {
        codepoint = codepointEnd = nextElement++;
        string = NULL;
        return TRUE;
    }
    if (range < endRange) {
        loadRange(++range);
        codepoint = codepointEnd = nextElement++;
        string = NULL;
        return TRUE;
    }

    if (nextString >= stringCount) return FALSE;
    codepoint = (UChar32)IS_STRING; // signal that value is actually a string
    string = (const UnicodeString*) set->strings->elementAt(nextString++);
    return TRUE;
}